

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall DStrifeStatusBar::DoCommonInit(DStrifeStatusBar *this)

{
  FTexture *pFVar1;
  DStrifeStatusBar *this_local;
  
  FImageCollection::Init(&this->Images,DoCommonInit::strifeLumpNames,0x22,0);
  pFVar1 = FImageCollection::operator[](&this->Images,0);
  this->CursorImage = (uint)(pFVar1 == (FTexture *)0x0);
  ST_SetNeedRefresh();
  this->CurrentPop = 0;
  this->PendingPop = -1;
  this->PopHeight = 0;
  this->KeyPopPos = 0;
  this->KeyPopScroll = 0;
  this->ItemFlash = 0.0;
  return;
}

Assistant:

void DoCommonInit ()
	{
		static const char *strifeLumpNames[] =
		{
			"INVCURS", "CURSOR01", "INVBACK", "INVTOP", "INVPOP", "INVPOP2",
			"INVPBAK", "INVPBAK2",
			"INVFONG0", "INVFONG1", "INVFONG2", "INVFONG3", "INVFONG4",
			"INVFONG5", "INVFONG6", "INVFONG7", "INVFONG8", "INVFONG9",
			"INVFONG%",
			"INVFONY0", "INVFONY1", "INVFONY2", "INVFONY3", "INVFONY4",
			"INVFONY5", "INVFONY6", "INVFONY7", "INVFONY8", "INVFONY9",
			"INVFONY%",
			"I_COMM", "I_MDKT", "I_ARM1", "I_ARM2"
		};

		Images.Init (strifeLumpNames, NUM_STRIFESB_IMAGES);

		CursorImage = Images[imgINVCURS] != NULL ? imgINVCURS : imgCURSOR01;

		ST_SetNeedRefresh();

		CurrentPop = POP_None;
		PendingPop = POP_NoChange;
		PopHeight = 0;
		KeyPopPos = 0;
		KeyPopScroll = 0;
		ItemFlash = 0;
	}